

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render.cpp
# Opt level: O0

void renderWave(void)

{
  float fVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  double dVar6;
  double dVar7;
  int y;
  int x;
  float a;
  int h;
  int w;
  
  iVar2 = al_get_bitmap_width(waveBitmap);
  iVar3 = al_get_bitmap_height(waveBitmap);
  fVar1 = waveAngle + 1.5707964;
  iVar4 = BB_W / 2;
  dVar6 = std::cos((double)(ulong)(uint)fVar1);
  iVar5 = BB_H / 2;
  dVar7 = std::sin((double)(ulong)(uint)fVar1);
  al_draw_rotated_bitmap
            ((float)(iVar2 / 2),(float)iVar3,(float)(int)(SUB84(dVar6,0) * 64.0 + (float)iVar4),
             (float)(int)(SUB84(dVar7,0) * 64.0 + (float)iVar5),waveAngle,waveBitmap,0,
             (long)iVar2 % 2 & 0xffffffff);
  return;
}

Assistant:

static void renderWave(void)
{
   int w = al_get_bitmap_width(waveBitmap);
   int h = al_get_bitmap_height(waveBitmap);

   float a = waveAngle + ALLEGRO_PI/2;

   int x = (int)(BB_W/2 + 64*cos(a));
   int y = (int)(BB_H/2 + 64*sin(a));

   al_draw_rotated_bitmap(waveBitmap, w/2, h,
      x, y, waveAngle, 0);
}